

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrespondent.c
# Opt level: O3

int nn_xrespondent_recv(nn_sockbase *self,nn_msg *msg)

{
  uint uVar1;
  uint32_t uVar2;
  void *pvVar3;
  size_t sVar4;
  ulong uVar5;
  nn_pipe *pipe;
  nn_chunkref ref;
  nn_pipe *local_50 [5];
  
  uVar1 = nn_fq_recv((nn_fq *)&self[2].sock,msg,local_50);
  if (-1 < (int)uVar1) {
    if ((uVar1 & 2) == 0) {
      pvVar3 = nn_chunkref_data(&msg->body);
      sVar4 = nn_chunkref_size(&msg->body);
      uVar5 = 0;
      do {
        if (sVar4 < uVar5 + 4) {
          nn_msg_term(msg);
          return -0xb;
        }
        uVar2 = nn_getl((uint8_t *)(uVar5 + (long)pvVar3));
        uVar5 = uVar5 + 4;
      } while (-1 < (int)uVar2);
      sVar4 = nn_chunkref_size(&msg->sphdr);
      if (sVar4 != 0) {
        nn_xrespondent_recv_cold_1();
        return -0x5c;
      }
      nn_xrespondent_recv_cold_2();
    }
    nn_xrespondent_recv_cold_3();
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

int nn_xrespondent_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xrespondent *xrespondent;
    struct nn_pipe *pipe;
    int i;
    size_t sz;
    void *data;
    struct nn_chunkref ref;
    struct nn_xrespondent_data *pipedata;

    xrespondent = nn_cont (self, struct nn_xrespondent, sockbase);

    rc = nn_fq_recv (&xrespondent->inpipes, msg, &pipe);
    if (nn_slow (rc < 0))
        return rc;

    /*  Split the header (including survey ID) from the body, if needed. */
    if (!(rc & NN_PIPE_PARSED)) {

        /*  Determine the size of the message header. */
        data = nn_chunkref_data (&msg->body);
        sz = nn_chunkref_size (&msg->body);
        i = 0;

        while (1) {
	    /*  Ignore the malformed surveys without the bottom of the stack. */
	    if (nn_slow ((i + 1) * sizeof (uint32_t) > sz)) {
                nn_msg_term (msg);
                return -EAGAIN;
            }

            /*  If the bottom of the backtrace stack is reached, proceed. */
            if (nn_getl ((uint8_t*)(((uint32_t*) data) + i)) & 0x80000000)
                break;

            ++i;
        }
        ++i;
    
        nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, i * sizeof (uint32_t));
        memcpy (nn_chunkref_data (&msg->sphdr), data, i * sizeof (uint32_t));
        nn_chunkref_trim (&msg->body, i * sizeof (uint32_t));
    }

    /*  Prepend the header by the pipe key. */
    pipedata = nn_pipe_getdata (pipe);
    nn_chunkref_init (&ref, nn_chunkref_size (&msg->sphdr) + sizeof (uint32_t));
    nn_putl (nn_chunkref_data (&ref), pipedata->outitem.key);
    memcpy (((uint8_t *) nn_chunkref_data (&ref)) + sizeof (uint32_t),
        nn_chunkref_data (&msg->sphdr), nn_chunkref_size (&msg->sphdr));
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_mv (&msg->sphdr, &ref);

    return 0;
}